

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O0

coda_cdf_time * time_type_new(int32_t data_type,coda_cdf_type *base_type)

{
  long lVar1;
  int iVar2;
  coda_type_special *pcVar3;
  coda_expression *local_38;
  coda_expression *expr;
  coda_cdf_time *type;
  char *exprstr;
  coda_cdf_type *base_type_local;
  coda_cdf_time *pcStack_10;
  int32_t data_type_local;
  
  exprstr = (char *)base_type;
  base_type_local._4_4_ = data_type;
  if ((data_type != 0x1f) && (data_type != 0x21)) {
    __assert_fail("data_type == 31 || data_type == 33",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                  ,0xd3,"coda_cdf_time *time_type_new(int32_t, coda_cdf_type *)");
  }
  expr = (coda_expression *)malloc(0x28);
  if (expr == (coda_expression *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,0xd9);
    pcStack_10 = (coda_cdf_time *)0x0;
  }
  else {
    expr->tag = expr_num_elements|expr_goto;
    expr->is_constant = 0;
    expr->recursion_depth = 0;
    expr[1].tag = expr_add;
    expr[2].tag = base_type_local._4_4_;
    expr[1].is_constant = 0;
    expr[1].recursion_depth = 0;
    if (base_type_local._4_4_ == expr_for) {
      type = (coda_cdf_time *)anon_var_dwarf_472b8;
    }
    else {
      type = (coda_cdf_time *)anon_var_dwarf_472ce;
    }
    iVar2 = coda_expression_from_string((char *)type,&local_38);
    if (iVar2 == 0) {
      pcVar3 = coda_type_time_new(coda_format_cdf,local_38);
      *(coda_type_special **)&expr->is_constant = pcVar3;
      lVar1._0_4_ = expr->is_constant;
      lVar1._4_4_ = expr->recursion_depth;
      if (lVar1 == 0) {
        coda_expression_delete(local_38);
        coda_cdf_type_delete((coda_dynamic_type *)expr);
        pcStack_10 = (coda_cdf_time *)0x0;
      }
      else {
        iVar2 = coda_type_time_set_base_type
                          (*(coda_type_special **)&expr->is_constant,*(coda_type **)(exprstr + 8));
        if (iVar2 == 0) {
          *(char **)&expr[1].is_constant = exprstr;
          pcStack_10 = (coda_cdf_time *)expr;
        }
        else {
          coda_cdf_type_delete((coda_dynamic_type *)expr);
          pcStack_10 = (coda_cdf_time *)0x0;
        }
      }
    }
    else {
      coda_cdf_type_delete((coda_dynamic_type *)expr);
      pcStack_10 = (coda_cdf_time *)0x0;
    }
  }
  return pcStack_10;
}

Assistant:

static coda_cdf_time *time_type_new(int32_t data_type, coda_cdf_type *base_type)
{
    char *exprstr;
    coda_cdf_time *type;
    coda_expression *expr;

    assert(data_type == 31 || data_type == 33);

    type = (coda_cdf_time *)malloc(sizeof(coda_cdf_time));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_cdf_time), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_cdf;
    type->definition = NULL;
    type->tag = tag_cdf_time;
    type->data_type = data_type;
    type->base_type = NULL;

    if (data_type == 31)
    {
        /* CDF_EPOCH */
        exprstr = "float(.) * 1e-3 - 63113904000.0";
    }
    else
    {
        /* CDF_TIME_TT2000 */
        exprstr = "float(.) * 1e-9 - 43200.0";
    }
    if (coda_expression_from_string(exprstr, &expr) != 0)
    {
        coda_cdf_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    type->definition = coda_type_time_new(coda_format_cdf, expr);
    if (type->definition == NULL)
    {
        coda_expression_delete(expr);
        coda_cdf_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    if (coda_type_time_set_base_type(type->definition, base_type->definition) != 0)
    {
        coda_cdf_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    type->base_type = (coda_dynamic_type *)base_type;

    return type;
}